

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3333::PrecomputeInternalForceMatricesWeightsPreInt
          (ChElementBeamANCF_3333 *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  Matrix3xN *lhs;
  undefined1 auVar21 [8];
  CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *pCVar22;
  double *pdVar23;
  long lVar24;
  double *pdVar25;
  ChMatrixNM<double,_3,_3> *pCVar26;
  element_type *peVar27;
  double *pdVar28;
  Index j;
  long lVar29;
  ulong uVar30;
  undefined1 *puVar31;
  Index outer_1;
  Index inner;
  undefined1 *puVar32;
  long lVar33;
  double *pdVar34;
  long lVar35;
  double *pdVar36;
  ActualDstType actualDst_1;
  Matrix<double,__1,__1,_0,__1,__1> *this_00;
  ActualDstType actualDst_2;
  long lVar37;
  long lVar38;
  ActualDstType actualDst;
  long lVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  ChMatrixNM<double,_6,_6> D;
  DstEvaluatorType dstEvaluator_1;
  ChMatrixNM<double,_3,_3> D22;
  ChMatrixNM<double,_3,_3> D11;
  SrcEvaluatorType srcEvaluator_1;
  ChMatrixNM<double,_3,_3> D33;
  MatrixNx3c Sxi_D_0xi;
  ChMatrix33<double> J_0xi_1;
  MatrixNxN Sxi_D_0xi_n_Sxi_D_0xi_c_transpose;
  ChMatrixNM<double,_9,_9> D_block;
  MatrixNx3c Sxi_D;
  double *local_12f0;
  undefined1 local_12d9;
  Matrix3xN *local_12d8;
  ulong local_12d0;
  element_type *local_12c8;
  undefined1 local_12c0 [8];
  double *pdStack_12b8;
  DstXprType *pDStack_12b0;
  Scalar SStack_12a8;
  Scalar SStack_12a0;
  Scalar SStack_1298;
  double dStack_1290;
  double dStack_1288;
  undefined1 local_1280 [16];
  Scalar SStack_1270;
  Scalar SStack_1268;
  double dStack_1260;
  double dStack_1258;
  double dStack_1250;
  Scalar SStack_1248;
  undefined1 local_1240 [16];
  double dStack_1230;
  LhsNested pMStack_1228;
  double dStack_1220;
  double dStack_1218;
  Scalar SStack_1210;
  Scalar SStack_1208;
  Scalar local_1200;
  Scalar SStack_11f8;
  Scalar SStack_11f0;
  Scalar SStack_11e8;
  double dStack_11e0;
  Scalar SStack_11d8;
  Scalar SStack_11d0;
  double *pdStack_11c8;
  Scalar SStack_11c0;
  Scalar SStack_11b8;
  Scalar SStack_11b0;
  double adStack_11a8 [5];
  double *local_1180;
  undefined8 uStack_1178;
  double *local_1170;
  double *pdStack_1168;
  Matrix<double,__1,__1,_0,__1,__1> *local_1158;
  undefined1 local_1150 [8];
  Matrix<double,_3,_3,_1,_3,_3> local_1148;
  Matrix<double,_3,_3,_1,_3,_3> local_1100;
  undefined1 *local_10b8;
  Matrix3xN *local_10b0;
  Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false>,_0>
  local_10a8;
  Transpose<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> local_1070;
  undefined1 local_1068 [80];
  double adStack_1018 [26];
  undefined1 local_f48 [24];
  double local_f30;
  double local_f28;
  double dStack_f20;
  double local_f18;
  double local_f10;
  double dStack_f08;
  undefined1 local_f00 [80];
  DstXprType local_eb0;
  double dStack_c28;
  undefined1 local_c20 [8];
  undefined1 auStack_c18 [48];
  double *pdStack_be8;
  Matrix<double,_3,_3,_1,_3,_3> *pMStack_be0;
  RhsNested RStack_bd8;
  Matrix<double,_9,_9,_1,_9,_9> *pMStack_bd0;
  double *pdStack_bc8;
  RhsNested pMStack_bc0;
  RhsNested RStack_bb8;
  double dStack_bb0;
  double dStack_ba8;
  double dStack_ba0;
  double dStack_b98;
  double local_b90;
  double dStack_b88;
  double dStack_b80;
  double dStack_b78;
  double dStack_b70;
  double dStack_b68;
  double dStack_b60;
  double dStack_b58;
  double local_b50;
  double dStack_b48;
  double dStack_b40;
  double dStack_b38;
  double dStack_b30;
  double dStack_b28;
  double dStack_b20;
  double dStack_b18;
  double local_b10;
  double dStack_b08;
  double dStack_b00;
  double dStack_af8;
  double dStack_af0;
  double dStack_ae8;
  double dStack_ae0;
  double dStack_ad8;
  double local_ad0;
  double dStack_ac8;
  double dStack_ac0;
  double dStack_ab8;
  double dStack_ab0;
  double dStack_aa8;
  double dStack_aa0;
  double dStack_a98;
  double local_a90;
  double dStack_a88;
  double dStack_a80;
  double dStack_a78;
  double local_a70;
  double dStack_a68;
  double local_a60;
  double dStack_a58;
  double local_a50;
  double dStack_a48;
  double local_a40;
  double dStack_a38;
  double local_a30;
  double dStack_a28;
  double local_a20;
  double dStack_a18;
  double local_a10;
  double dStack_a08;
  double local_a00;
  double dStack_9f8;
  double local_9f0;
  double dStack_9e8;
  double local_9e0 [14];
  double local_970;
  undefined1 *local_968;
  undefined1 local_960 [64];
  double local_920 [72];
  double local_6e0;
  undefined1 *local_6d8;
  undefined1 local_6d0 [64];
  double local_690 [72];
  double local_450;
  undefined1 local_440 [64];
  Matrix<double,_9,_9,_1,_9,_9> local_3d8;
  
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->m_O1,0x19a1,0x51,0x51);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->m_O2,0x19a1,0x51,0x51);
  this_00 = &this->m_K3Compact;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)this_00,0x51,9,9);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->m_K13Compact,0x51,9,9);
  local_c20 = (undefined1  [8])
              (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows;
  auStack_c18._0_8_ =
       (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
       m_storage.m_cols;
  auStack_c18._8_8_ = 0.0;
  if (-1 < (long)(auStack_c18._0_8_ | (ulong)local_c20)) {
    Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              (&this->m_K13Compact,
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                *)local_c20,(assign_op<double,_double> *)&local_3d8);
    local_c20 = (undefined1  [8])
                (this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                .m_storage.m_rows;
    auStack_c18._0_8_ =
         (this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_cols;
    auStack_c18._8_8_ = 0.0;
    if (-1 < (long)(auStack_c18._0_8_ | (ulong)local_c20)) {
      Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                (this_00,(CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          *)local_c20,(assign_op<double,_double> *)&local_3d8);
      local_c20 = (undefined1  [8])
                  (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
      auStack_c18._0_8_ =
           (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
      auStack_c18._8_8_ = 0.0;
      if (-1 < (long)(auStack_c18._0_8_ | (ulong)local_c20)) {
        Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  (&this->m_O1,
                   (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    *)local_c20,(assign_op<double,_double> *)&local_3d8);
        local_12c8 = (this->m_material).
                     super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
        p_Var9 = (this->m_material).
                 super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
        }
        SStack_11c0 = 0.0;
        SStack_11b8 = 0.0;
        SStack_11b0 = 0.0;
        local_1200 = 0.0;
        SStack_11f8 = 0.0;
        SStack_11f0 = 0.0;
        SStack_11e8 = 0.0;
        SStack_11d8 = 0.0;
        SStack_11d0 = 0.0;
        pdStack_11c8 = (double *)0x0;
        _local_1280 = ZEXT1648(ZEXT816(0));
        local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.
        array[0] = (local_12c8->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                   m_storage.m_data.array[0];
        dStack_1288 = *(double *)
                       ((long)(local_12c8->m_D0).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array + 8);
        _local_12c0 = ZEXT856((ulong)local_3d8.
                                     super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                                     m_storage.m_data.array[0]);
        dStack_1250 = *(double *)
                       ((long)(local_12c8->m_D0).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array + 0x10);
        SStack_1248 = 0.0;
        _local_1240 = ZEXT1640(ZEXT816(0));
        _local_1240 = ZEXT4864(CONCAT840(*(double *)
                                          ((long)(local_12c8->m_D0).
                                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                                 .m_storage.m_data.array + 0x18),_local_1240));
        dStack_11e0 = *(double *)
                       ((long)(local_12c8->m_D0).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array + 0x20);
        adStack_11a8[0] =
             *(double *)
              ((long)(local_12c8->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                     .m_storage.m_data.array + 0x28);
        local_c20 = (undefined1  [8])&local_3d8;
        auStack_c18._0_8_ =
             (Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false>,_0>
              *)0x0;
        auStack_c18._8_8_ = (undefined1 *)0x1;
        auStack_c18._16_8_ = (DstXprType *)0x1;
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            ((CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)local_c20,
                             (Scalar *)(local_12c0 + 0x28));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_12c0 + 0x20));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_12c0 + 0x28));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_12c0 + 8));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_12c0 + 0x18));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_12c0 + 0x20));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_12c0 + 0x18));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_12c0 + 0x10));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&SStack_11d0);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,adStack_11a8);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&SStack_11b0);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,adStack_11a8);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)&pdStack_11c8);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&SStack_11b8);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&SStack_11b0);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&SStack_11b8);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&SStack_11c0);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&local_1200);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&SStack_11d8);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&dStack_11e0);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&SStack_11d8);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&SStack_11f8);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&SStack_11e8);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&dStack_11e0);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&SStack_11e8);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&SStack_11f0);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&SStack_11d0);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,adStack_11a8);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&SStack_11b0);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,adStack_11a8);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)&pdStack_11c8);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&SStack_11b8);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&SStack_11b0);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&SStack_11b8);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&SStack_11c0);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_12c0 + 0x30));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1280 + 0x18));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1280 + 0x10));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1280 + 0x18));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_12c0 + 0x38));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1280 + 8));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1280 + 0x10));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1280 + 8));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)local_1280);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1240 + 0x10));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1240 + 0x38));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1240 + 0x30));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1240 + 0x38));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1240 + 0x18));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1240 + 0x28));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1240 + 0x30));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1240 + 0x28));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1240 + 0x20));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&local_1200);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&SStack_11d8);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&dStack_11e0);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&SStack_11d8);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&SStack_11f8);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&SStack_11e8);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&dStack_11e0);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&SStack_11e8);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,&SStack_11f0);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1240 + 0x10));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1240 + 0x38));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1240 + 0x30));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1240 + 0x38));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1240 + 0x18));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1240 + 0x28));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1240 + 0x30));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1240 + 0x28));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1240 + 0x20));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1280 + 0x20));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1240 + 8));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)local_1240);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1240 + 8));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1280 + 0x28));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1280 + 0x38));
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)local_1240);
        pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar22,(Scalar *)(local_1280 + 0x38));
        Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                  (pCVar22,(Scalar *)(local_1280 + 0x30));
        if (((long)(((PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)auStack_c18._16_8_)->
                   m_storage).m_data.array + auStack_c18._0_8_ == 9) &&
           ((undefined1 *)auStack_c18._8_8_ == (undefined1 *)0x9)) {
          local_1158 = this_00;
          if (*(long *)(DAT_00b6ab90 + 0x38) != *(long *)(DAT_00b6ab90 + 0x30)) {
            auVar43 = vpmovsxbq_avx512f(ZEXT816(0x302010008));
            auVar44 = vpmovsxbq_avx512f(ZEXT816(0x9080403020100));
            local_12d0 = 0;
            auVar42 = vpbroadcastq_avx512vl();
            auVar10 = vpaddq_avx2(auVar42,_DAT_009a7b40);
            auVar40 = vpaddq_avx(auVar42._0_16_,_DAT_009a7bc0);
            local_10b0 = &this->m_ebar0;
            auVar43 = vpermi2q_avx512f(auVar43,ZEXT3264(auVar10),ZEXT3264(auVar42));
            auVar43 = vpermi2q_avx512f(auVar44,auVar43,ZEXT1664(auVar40));
            auVar44 = vpbroadcastq_avx512f();
            auVar44._0_56_ = auVar43._0_56_;
            local_f00._0_64_ = vmovdqa64_avx512f(auVar44);
            lVar29 = DAT_00b6ab90;
            do {
              lVar24 = *(long *)(lVar29 + 0x18);
              lVar39 = *(long *)(lVar29 + 0x20);
              if (lVar39 != lVar24) {
                local_12d8 = (Matrix3xN *)0x0;
                do {
                  if (lVar39 == lVar24) break;
                  puVar31 = (undefined1 *)0x0;
                  do {
                    dVar2 = *(double *)(*(long *)(static_tables_3333 + 0x30) + local_12d0 * 8);
                    dVar3 = *(double *)(*(long *)(static_tables_3333 + 0x18) + (long)local_12d8 * 8)
                    ;
                    local_1180 = *(double **)
                                  (*(long *)(static_tables_3333 + 0x18) + (long)puVar31 * 8);
                    local_10b8 = puVar31;
                    Calc_Sxi_D(this,(MatrixNx3c *)&stack0xfffffffffffffeb0,
                               *(double *)(*(long *)(lVar29 + 0x30) + local_12d0 * 8),
                               *(double *)(lVar24 + (long)local_12d8 * 8),
                               *(double *)(lVar24 + (long)puVar31 * 8));
                    Eigen::internal::
                    generic_product_impl<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,Eigen::DenseShape,Eigen::DenseShape,8>
                    ::evalTo<Eigen::Matrix<double,3,3,1,3,3>>
                              (&local_1100,local_10b0,
                               (Matrix<double,_9,_3,_0,_9,_3> *)&stack0xfffffffffffffeb0);
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0] = (double)&stack0xfffffffffffffeb0;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[1] = (double)&local_1100;
                    local_c20 = (undefined1  [8])&stack0xfffffffffffffeb0;
                    Eigen::internal::
                    Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
                    ::run((Matrix<double,_3,_3,_1,_3,_3> *)auStack_c18,
                          (SrcXprType *)
                          (local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                           m_storage.m_data.array + 1),(assign_op<double,_double> *)&local_1148);
                    auVar21 = local_c20;
                    lVar29 = 7;
                    pdVar23 = adStack_1018 + 7;
                    pMStack_bd0 = (Matrix<double,_9,_9,_1,_9,_9> *)local_c20;
                    pdStack_bc8 = (double *)auStack_c18;
                    pMStack_bc0 = (RhsNested)0x3;
                    do {
                      dVar4 = local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>
                              .m_storage.m_data.array[lVar29 + 0x4c];
                      dVar5 = local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>
                              .m_storage.m_data.array[lVar29 + 0x4f];
                      auVar57._8_8_ = dVar5;
                      auVar57._0_8_ = dVar5;
                      dVar6 = *(double *)(auStack_c18 + lVar29 * 8 + -8);
                      auVar62._8_8_ = dVar6;
                      auVar62._0_8_ = dVar6;
                      lVar29 = lVar29 + 1;
                      auVar40._0_8_ = dVar4 * *(double *)auVar21;
                      auVar40._8_8_ = dVar4 * *(double *)((long)auVar21 + 8);
                      auVar40 = vfmadd231pd_fma(auVar40,auVar57,
                                                *(undefined1 (*) [16])((long)auVar21 + 0x48));
                      auVar40 = vfmadd231pd_fma(auVar40,auVar62,
                                                *(undefined1 (*) [16])((long)auVar21 + 0x90));
                      *(undefined1 (*) [16])(pdVar23 + -8) = auVar40;
                      auVar48._0_8_ = dVar4 * *(double *)((long)auVar21 + 0x10);
                      auVar48._8_8_ = dVar4 * *(double *)((long)auVar21 + 0x18);
                      auVar40 = vfmadd231pd_fma(auVar48,auVar57,
                                                *(undefined1 (*) [16])((long)auVar21 + 0x58));
                      auVar40 = vfmadd231pd_fma(auVar40,auVar62,
                                                *(undefined1 (*) [16])((long)auVar21 + 0xa0));
                      *(undefined1 (*) [16])(pdVar23 + -6) = auVar40;
                      auVar41._0_8_ = dVar4 * *(double *)((long)auVar21 + 0x20);
                      auVar41._8_8_ = dVar4 * *(double *)((long)auVar21 + 0x28);
                      auVar40 = vfmadd231pd_fma(auVar41,auVar57,
                                                *(undefined1 (*) [16])((long)auVar21 + 0x68));
                      auVar40 = vfmadd231pd_fma(auVar40,auVar62,
                                                *(undefined1 (*) [16])((long)auVar21 + 0xb0));
                      *(undefined1 (*) [16])(pdVar23 + -4) = auVar40;
                      auVar49._0_8_ = dVar4 * *(double *)((long)auVar21 + 0x30);
                      auVar49._8_8_ = dVar4 * *(double *)((long)auVar21 + 0x38);
                      auVar40 = vfmadd231pd_fma(auVar49,auVar57,
                                                *(undefined1 (*) [16])((long)auVar21 + 0x78));
                      auVar40 = vfmadd231pd_fma(auVar40,auVar62,
                                                *(undefined1 (*) [16])((long)auVar21 + 0xc0));
                      *(undefined1 (*) [16])(pdVar23 + -2) = auVar40;
                      *pdVar23 = dVar4 * *(double *)((long)auVar21 + 0x40) +
                                 dVar5 * *(double *)((long)auVar21 + 0x88) +
                                 dVar6 * *(double *)((long)auVar21 + 0xd0);
                      pdVar23 = pdVar23 + 9;
                    } while (lVar29 != 10);
                    auVar67._8_8_ = 0;
                    auVar67._0_8_ =
                         local_1100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[7];
                    auVar50._8_8_ = 0;
                    auVar50._0_8_ =
                         local_1100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[3];
                    auVar58._8_8_ = 0;
                    auVar58._0_8_ =
                         local_1100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[4];
                    auVar63._8_8_ = 0;
                    auVar63._0_8_ =
                         local_1100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[8];
                    lVar29 = 0;
                    auVar68._8_8_ = 0;
                    auVar68._0_8_ =
                         local_1100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[7] *
                         local_1100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[5];
                    auVar40 = vfmsub231sd_fma(auVar68,auVar58,auVar63);
                    auVar66._8_8_ = 0;
                    auVar66._0_8_ =
                         local_1100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[6] *
                         local_1100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[5];
                    auVar48 = vfmsub231sd_fma(auVar66,auVar50,auVar63);
                    auVar59._8_8_ = 0;
                    auVar59._0_8_ =
                         local_1100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[6] *
                         local_1100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[4];
                    auVar41 = vfmsub231sd_fma(auVar59,auVar50,auVar67);
                    dVar4 = (local_12c8->m_D0).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                            m_data.array[0];
                    auVar11._8_8_ = 0x8000000000000000;
                    auVar11._0_8_ = 0x8000000000000000;
                    auVar51._8_8_ = 0;
                    auVar51._0_8_ =
                         auVar41._0_8_ *
                         local_1100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[2] +
                         (auVar40._0_8_ *
                          local_1100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                          m_storage.m_data.array[0] -
                         auVar48._0_8_ *
                         local_1100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                         m_storage.m_data.array[1]);
                    auVar40 = vxorpd_avx512vl(auVar51,auVar11);
                    local_1180 = (double *)(dVar3 * dVar2 * (double)local_1180 * auVar40._0_8_);
                    auStack_c18._0_8_ = (double)local_1180 * 0.5;
                    dVar2 = *(double *)
                             ((long)(local_12c8->m_D0).
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array + 8);
                    uStack_1178 = 0;
                    dVar3 = *(double *)
                             ((long)(local_12c8->m_D0).
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array + 0x10);
                    auStack_c18._32_8_ = (Matrix<double,_3,_3,_1,_3,_3> *)(auStack_c18 + 0x28);
                    pdVar23 = &dStack_bb0;
                    do {
                      dVar5 = adStack_1018[lVar29 + -1];
                      lVar29 = lVar29 + 1;
                      pdVar23[-8] = dVar4 * (double)local_1068._72_8_ * dVar5;
                      pdVar23[-7] = dVar4 * adStack_1018[0] * dVar5;
                      pdVar23[-6] = dVar4 * adStack_1018[1] * dVar5;
                      pdVar23[-5] = dVar4 * adStack_1018[2] * dVar5;
                      pdVar23[-4] = dVar4 * adStack_1018[3] * dVar5;
                      pdVar23[-3] = dVar4 * adStack_1018[4] * dVar5;
                      pdVar23[-2] = dVar4 * adStack_1018[5] * dVar5;
                      pdVar23[-1] = dVar4 * adStack_1018[6] * dVar5;
                      *pdVar23 = dVar4 * adStack_1018[7] * dVar5;
                      pdVar23 = pdVar23 + 9;
                    } while (lVar29 != 9);
                    pdVar23 = local_920;
                    local_968 = local_960;
                    lVar29 = 9;
                    do {
                      dVar4 = adStack_1018[lVar29 + -1];
                      lVar29 = lVar29 + 1;
                      pdVar23[-8] = dVar2 * adStack_1018[8] * dVar4;
                      pdVar23[-7] = dVar2 * adStack_1018[9] * dVar4;
                      pdVar23[-6] = dVar2 * adStack_1018[10] * dVar4;
                      pdVar23[-5] = dVar2 * adStack_1018[0xb] * dVar4;
                      pdVar23[-4] = dVar2 * adStack_1018[0xc] * dVar4;
                      pdVar23[-3] = dVar2 * adStack_1018[0xd] * dVar4;
                      pdVar23[-2] = dVar2 * adStack_1018[0xe] * dVar4;
                      pdVar23[-1] = dVar2 * adStack_1018[0xf] * dVar4;
                      *pdVar23 = dVar2 * adStack_1018[0x10] * dVar4;
                      pdVar23 = pdVar23 + 9;
                    } while (lVar29 != 0x12);
                    pdVar23 = local_690;
                    local_6d8 = local_6d0;
                    lVar29 = 0x12;
                    do {
                      dVar2 = adStack_1018[lVar29 + -1];
                      lVar29 = lVar29 + 1;
                      pdVar23[-8] = dVar3 * adStack_1018[0x11] * dVar2;
                      pdVar23[-7] = dVar3 * adStack_1018[0x12] * dVar2;
                      pdVar23[-6] = dVar3 * adStack_1018[0x13] * dVar2;
                      pdVar23[-5] = dVar3 * adStack_1018[0x14] * dVar2;
                      pdVar23[-4] = dVar3 * adStack_1018[0x15] * dVar2;
                      pdVar23[-3] = dVar3 * adStack_1018[0x16] * dVar2;
                      pdVar23[-2] = dVar3 * adStack_1018[0x17] * dVar2;
                      pdVar23[-1] = dVar3 * adStack_1018[0x18] * dVar2;
                      *pdVar23 = dVar3 * adStack_1018[0x19] * dVar2;
                      pdVar23 = pdVar23 + 9;
                    } while (lVar29 != 0x1b);
                    if (((this->m_K3Compact).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_rows != 9) ||
                       ((this->m_K3Compact).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols != 9)) {
                      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 9, 9>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 9, 1>>, const Eigen::Block<Eigen::Matrix<double, 9, 3, 0>, 9, 1>>, Eigen::Transpose<Eigen::Block<Eigen::Matrix<double, 9, 3, 0>, 9, 1>>>, const Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 9, 1>>, const Eigen::Block<Eigen::Matrix<double, 9, 3, 0>, 9, 1>>, Eigen::Transpose<Eigen::Block<Eigen::Matrix<double, 9, 3, 0>, 9, 1>>>>, const Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 9, 1>>, const Eigen::Block<Eigen::Matrix<double, 9, 3, 0>, 9, 1>>, Eigen::Transpose<Eigen::Block<Eigen::Matrix<double, 9, 3, 0>, 9, 1>>>>>, Functor = Eigen::internal::add_assign_op<double, double>]"
                                   );
                    }
                    pdVar23 = (this_00->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                              m_storage.m_data;
                    uVar30 = 0xfffffffffffffff8;
                    do {
                      auVar43 = vaddpd_avx512f(*(undefined1 (*) [64])(&dStack_bb0 + uVar30),
                                               *(undefined1 (*) [64])(local_920 + uVar30));
                      auVar44 = vaddpd_avx512f(auVar43,*(undefined1 (*) [64])(local_690 + uVar30));
                      auVar43._8_8_ = auStack_c18._0_8_;
                      auVar43._0_8_ = auStack_c18._0_8_;
                      auVar43._16_8_ = auStack_c18._0_8_;
                      auVar43._24_8_ = auStack_c18._0_8_;
                      auVar43._32_8_ = auStack_c18._0_8_;
                      auVar43._40_8_ = auStack_c18._0_8_;
                      auVar43._48_8_ = auStack_c18._0_8_;
                      auVar43._56_8_ = auStack_c18._0_8_;
                      auVar43 = vmulpd_avx512f(auVar44,auVar43);
                      auVar43 = vaddpd_avx512f(auVar43,*(undefined1 (*) [64])(pdVar23 + uVar30 + 8))
                      ;
                      *(undefined1 (*) [64])(pdVar23 + uVar30 + 8) = auVar43;
                      uVar30 = uVar30 + 8;
                    } while (uVar30 < 0x48);
                    pdVar28 = (double *)(local_1068 + 0x48);
                    pdVar23[0x50] =
                         (local_970 + local_6e0 + local_450) * (double)auStack_c18._0_8_ +
                         pdVar23[0x50];
                    lVar29 = 0;
                    local_1170 = local_1180;
                    pdStack_1168 = local_1180;
                    do {
                      local_440._0_8_ = lVar29;
                      lVar39 = 0;
                      do {
                        local_1148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                        m_storage.m_data.array[5] = (double)(lVar39 * 3);
                        local_1148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                        m_storage.m_data.array[0] = (double)(local_1068 + 0x48);
                        local_1148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                        m_storage.m_data.array[3] = (double)&local_3d8;
                        local_1148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                        m_storage.m_data.array[1] =
                             (double)(local_3d8.
                                      super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                                      m_storage.m_data.array + lVar29 * 0x1b + lVar39 * 3);
                        local_1148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                        m_storage.m_data.array[6] = 4.44659081257122e-323;
                        local_1148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                        m_storage.m_data.array[4] = (double)(lVar29 * 3);
                        local_1148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                        m_storage.m_data.array[7] =
                             local_1148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                             .m_storage.m_data.array[0];
                        memset((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_9,_9,_1,_9,_9>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
                                *)local_c20,0,0x288);
                        local_1068._0_8_ = 1.0;
                        Eigen::internal::
                        generic_product_impl<Eigen::Product<Eigen::Matrix<double,9,3,0,9,3>,Eigen::Block<Eigen::Matrix<double,9,9,1,9,9>,3,3,false>,0>,Eigen::Transpose<Eigen::Matrix<double,9,3,0,9,3>>,Eigen::DenseShape,Eigen::DenseShape,8>
                        ::scaleAndAddTo<Eigen::Matrix<double,9,9,1,9,9>>
                                  ((Matrix<double,_9,_9,_1,_9,_9> *)local_c20,
                                   (Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false>,_0>
                                    *)&local_1148,
                                   (Transpose<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)
                                   (local_1148.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                    m_storage.m_data.array + 7),(Scalar *)local_1068);
                        local_1068._0_8_ = &local_eb0;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[2] = (double)auStack_c18._8_8_;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[3] = (double)auStack_c18._16_8_;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[4] = (double)auStack_c18._24_8_;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[5] = (double)auStack_c18._32_8_;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[6] = (double)auStack_c18._40_8_;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[7] = (double)pdStack_be8;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[8] = (double)pMStack_be0;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[9] = (double)RStack_bd8.m_matrix;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[10] = (double)pMStack_bd0;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0xb] = (double)pdStack_bc8;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0xc] = (double)pMStack_bc0;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0xd] = (double)RStack_bb8.m_matrix;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0xe] = dStack_bb0;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0xf] = dStack_ba8;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x10] = dStack_ba0;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x11] = dStack_b98;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x12] = local_b90;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x13] = dStack_b88;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x14] = dStack_b80;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x15] = dStack_b78;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x16] = dStack_b70;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x17] = dStack_b68;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x18] = dStack_b60;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x19] = dStack_b58;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x1a] = local_b50;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x1b] = dStack_b48;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x1c] = dStack_b40;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x1d] = dStack_b38;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x1e] = dStack_b30;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x1f] = dStack_b28;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x20] = dStack_b20;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x21] = dStack_b18;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x22] = local_b10;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x23] = dStack_b08;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x24] = dStack_b00;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x25] = dStack_af8;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x26] = dStack_af0;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x27] = dStack_ae8;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x28] = dStack_ae0;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x29] = dStack_ad8;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x2a] = local_ad0;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x2b] = dStack_ac8;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x2c] = dStack_ac0;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x2d] = dStack_ab8;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x2e] = dStack_ab0;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x2f] = dStack_aa8;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x30] = dStack_aa0;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x31] = dStack_a98;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x32] = local_a90;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x33] = dStack_a88;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x34] = dStack_a80;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x35] = dStack_a78;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x36] = local_a70;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x37] = dStack_a68;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x38] = local_a60;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x39] = dStack_a58;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x3a] = local_a50;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x3b] = dStack_a48;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x3c] = local_a40;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x3d] = dStack_a38;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x3e] = local_a30;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x3f] = dStack_a28;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0] = (double)local_1170 * (double)local_c20;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[1] = (double)pdStack_1168 * (double)auStack_c18._0_8_
                        ;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x40] = local_a20;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x41] = dStack_a18;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x42] = local_a10;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x43] = dStack_a08;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x44] = local_a00;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x45] = dStack_9f8;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x46] = local_9f0;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x47] = dStack_9e8;
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x48] = local_9e0[0];
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x49] = local_9e0[1];
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x4a] = local_9e0[2];
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x4b] = local_9e0[3];
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x4c] = local_9e0[4];
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x4d] = local_9e0[5];
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x4e] = local_9e0[6];
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x4f] = local_9e0[7];
                        local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                        m_storage.m_data.array[0x50] = local_9e0[8];
                        local_1148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                        m_storage.m_data.array[0] = (double)local_1180;
                        local_c20 = (undefined1  [8])local_1068;
                        auStack_c18._0_8_ =
                             (Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false>,_0>
                              *)&local_1148;
                        auStack_c18._8_8_ = local_f48;
                        auStack_c18._16_8_ = local_1068._0_8_;
                        Eigen::internal::
                        copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_9,_9,_1,_9,_9>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>,_2,_80>
                        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_9,_9,_1,_9,_9>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
                               *)local_c20);
                        *(double *)(*(long *)local_c20 + 0x280) =
                             *(double *)auStack_c18._0_8_ * *(double *)(*(long *)local_c20 + 0x280);
                        dVar3 = adStack_1018[lVar39 * 9 + -1];
                        dVar4 = adStack_1018[lVar39 * 9];
                        dVar5 = adStack_1018[lVar39 * 9 + 1];
                        dVar6 = adStack_1018[lVar39 * 9 + 2];
                        dVar15 = adStack_1018[lVar39 * 9 + 3];
                        dVar16 = adStack_1018[lVar39 * 9 + 4];
                        dVar17 = adStack_1018[lVar39 * 9 + 5];
                        dVar18 = adStack_1018[lVar39 * 9 + 6];
                        dVar2 = adStack_1018[lVar39 * 9 + 7];
                        lVar24 = 8;
                        pdVar23 = pdVar28;
                        do {
                          dVar7 = *pdVar23;
                          pdVar23 = pdVar23 + 1;
                          local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[lVar24 + 0x4a] = dVar3 * dVar7;
                          local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[lVar24 + 0x4b] = dVar4 * dVar7;
                          local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[lVar24 + 0x4c] = dVar7 * dVar5;
                          local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[lVar24 + 0x4d] = dVar7 * dVar6;
                          local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[lVar24 + 0x4e] = dVar7 * dVar15;
                          local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[lVar24 + 0x4f] = dVar7 * dVar16;
                          local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[lVar24 + 0x50] = dVar7 * dVar17;
                          (&dStack_c28)[lVar24] = dVar7 * dVar18;
                          *(double *)(auStack_c18 + lVar24 * 8 + -8) = dVar7 * dVar2;
                          lVar24 = lVar24 + 9;
                        } while (lVar24 != 0x59);
                        auVar43 = vmovdqa64_avx512f(local_f00._0_64_);
                        lVar33 = 0;
                        lVar24 = (this->m_O1).
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                 m_storage.m_rows;
                        pdVar23 = (this->m_O1).
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                  m_storage.m_data + 8;
                        do {
                          lVar38 = (this->m_O1).
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_cols;
                          lVar35 = 0;
                          pdVar25 = pdVar23;
                          do {
                            if ((lVar24 < lVar35 * 9 + 9) || (lVar38 < lVar33 * 9 + 9))
                            goto LAB_0072a57e;
                            lVar37 = 0;
                            dVar2 = local_eb0.
                                    super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                                    m_storage.m_data.array[lVar33 + lVar35 * 9];
                            auVar46._8_8_ = 0;
                            auVar46._0_8_ = dVar2;
                            auVar44 = vbroadcastsd_avx512f(auVar46);
                            pdVar34 = pdVar25;
                            do {
                              auVar45 = vpbroadcastq_avx512f();
                              auVar45 = vpsllq_avx512f(auVar45,3);
                              vpaddq_avx512f(auVar43,auVar45);
                              auVar45 = vgatherqpd_avx512f(*(undefined8 *)(lVar24 * 8));
                              auVar45 = vmulpd_avx512f(auVar44,auVar45);
                              auVar45 = vaddpd_avx512f(auVar45,*(undefined1 (*) [64])(pdVar34 + -8))
                              ;
                              *(undefined1 (*) [64])(pdVar34 + -8) = auVar45;
                              pdVar36 = local_9e0 + lVar37;
                              lVar37 = lVar37 + 1;
                              *pdVar34 = dVar2 * *pdVar36 + *pdVar34;
                              pdVar34 = pdVar34 + lVar24;
                            } while (lVar37 != 9);
                            lVar35 = lVar35 + 1;
                            pdVar25 = pdVar25 + 9;
                          } while (lVar35 != 9);
                          lVar33 = lVar33 + 1;
                          pdVar23 = pdVar23 + lVar24 * 9;
                        } while (lVar33 != 9);
                        lVar39 = lVar39 + 1;
                      } while (lVar39 != 3);
                      pdVar28 = pdVar28 + 9;
                      lVar29 = local_440._0_8_ + 1;
                    } while (lVar29 != 3);
                    puVar31 = (undefined1 *)(ulong)((int)local_10b8 + 1);
                    lVar39 = *(long *)(DAT_00b6ab90 + 0x20);
                    lVar24 = *(long *)(DAT_00b6ab90 + 0x18);
                    puVar32 = (undefined1 *)(lVar39 - lVar24 >> 3);
                    lVar29 = DAT_00b6ab90;
                    this_00 = local_1158;
                  } while (puVar31 < puVar32);
                  local_12d8 = (Matrix3xN *)(ulong)((int)local_12d8 + 1);
                } while (local_12d8 < puVar32);
              }
              local_12d0 = (ulong)((int)local_12d0 + 1);
            } while (local_12d0 < (ulong)(*(long *)(lVar29 + 0x38) - *(long *)(lVar29 + 0x30) >> 3))
            ;
          }
          auVar44 = ZEXT1664((undefined1  [16])0x0);
          auVar43 = vmovdqu64_avx512f(auVar44);
          SStack_11c0 = auVar43._32_8_;
          SStack_11b8 = auVar43._40_8_;
          SStack_11b0 = auVar43._48_8_;
          adStack_11a8[0] = auVar43._56_8_;
          auVar43 = vmovdqa64_avx512f(auVar44);
          local_1200 = auVar43._0_8_;
          SStack_11f8 = auVar43._8_8_;
          SStack_11f0 = auVar43._16_8_;
          SStack_11e8 = auVar43._24_8_;
          dStack_11e0 = auVar43._32_8_;
          SStack_11d8 = auVar43._40_8_;
          SStack_11d0 = auVar43._48_8_;
          pdStack_11c8 = auVar43._56_8_;
          _local_1240 = vmovdqa64_avx512f(auVar44);
          _local_1280 = vmovdqa64_avx512f(auVar44);
          _local_12c0 = vmovdqa64_avx512f(auVar44);
          peVar27 = (this->m_material).
                    super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          p_Var9 = (this->m_material).
                   super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
            }
          }
          pCVar26 = &peVar27->m_Dv;
          puVar31 = local_12c0;
          lVar29 = 0;
          do {
            lVar39 = 0;
            do {
              *(double *)(puVar31 + lVar39 * 8) =
                   (pCVar26->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage
                   .m_data.array[lVar39];
              lVar39 = lVar39 + 1;
            } while (lVar39 != 3);
            lVar29 = lVar29 + 1;
            pCVar26 = (ChMatrixNM<double,_3,_3> *)
                      ((pCVar26->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
                       m_storage.m_data.array + 3);
            puVar31 = puVar31 + 0x30;
          } while (lVar29 != 3);
          if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
          }
          local_c20 = (undefined1  [8])&local_3d8;
          auStack_c18._0_8_ =
               (Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false>,_0>
                *)0x0;
          auStack_c18._8_8_ = (undefined1 *)0x1;
          auStack_c18._16_8_ = (DstXprType *)0x1;
          local_1148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[0] = (double)pdStack_12b8;
          local_1100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[0] = (double)local_12c0;
          local_1100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[4] = dStack_1290;
          local_1100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[8] = dStack_1260;
          local_1100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[3] = SStack_11d0;
          local_1100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[1] = SStack_11d0;
          local_3d8.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.
          array[0] = (double)local_12c0;
          local_1068._0_8_ = pDStack_12b0;
          local_1100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[6] = local_1200;
          local_1100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[2] = local_1200;
          local_1100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[7] = dStack_1230;
          local_1100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[5] = dStack_1230;
          local_1068._32_8_ = local_1280._0_8_;
          local_1148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[4] = dStack_1288;
          local_1148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[8] = dStack_1258;
          local_1068._64_8_ = dStack_1250;
          local_1148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[3] = (double)pdStack_11c8;
          local_1148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[1] = (double)pdStack_11c8;
          local_1148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[6] = SStack_11f8;
          local_1148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[2] = SStack_11f8;
          local_1068._24_8_ = SStack_11c0;
          local_1068._8_8_ = SStack_11c0;
          local_1148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[7] = (double)pMStack_1228;
          local_1148.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[5] = (double)pMStack_1228;
          local_1068._48_8_ = SStack_11f0;
          local_1068._16_8_ = SStack_11f0;
          local_1068._56_8_ = dStack_1220;
          local_1068._40_8_ = dStack_1220;
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              ((CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)local_c20,
                               (Scalar *)(local_12c0 + 0x28));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_12c0 + 0x20));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_12c0 + 0x28));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_12c0 + 8));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_12c0 + 0x18));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_12c0 + 0x20));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_12c0 + 0x18));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_12c0 + 0x10));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&SStack_11d0);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,adStack_11a8);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&SStack_11b0);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,adStack_11a8);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)&pdStack_11c8);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&SStack_11b8);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&SStack_11b0);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&SStack_11b8);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&SStack_11c0);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&local_1200);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&SStack_11d8);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&dStack_11e0);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&SStack_11d8);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&SStack_11f8);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&SStack_11e8);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&dStack_11e0);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&SStack_11e8);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&SStack_11f0);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&SStack_11d0);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,adStack_11a8);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&SStack_11b0);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,adStack_11a8);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)&pdStack_11c8);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&SStack_11b8);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&SStack_11b0);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&SStack_11b8);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&SStack_11c0);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_12c0 + 0x30));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1280 + 0x18));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1280 + 0x10));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1280 + 0x18));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_12c0 + 0x38));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1280 + 8));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1280 + 0x10));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1280 + 8));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)local_1280);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1240 + 0x10));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1240 + 0x38));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1240 + 0x30));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1240 + 0x38));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1240 + 0x18));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1240 + 0x28));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1240 + 0x30));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1240 + 0x28));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1240 + 0x20));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&local_1200);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&SStack_11d8);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&dStack_11e0);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&SStack_11d8);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&SStack_11f8);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&SStack_11e8);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&dStack_11e0);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&SStack_11e8);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,&SStack_11f0);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1240 + 0x10));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1240 + 0x38));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1240 + 0x30));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1240 + 0x38));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1240 + 0x18));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1240 + 0x28));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1240 + 0x30));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1240 + 0x28));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1240 + 0x20));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1280 + 0x20));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1240 + 8));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)local_1240);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1240 + 8));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1280 + 0x28));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1280 + 0x38));
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)local_1240);
          pCVar22 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                              (pCVar22,(Scalar *)(local_1280 + 0x38));
          Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                    (pCVar22,(Scalar *)(local_1280 + 0x30));
          if (((long)(((PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)auStack_c18._16_8_)
                     ->m_storage).m_data.array + auStack_c18._0_8_ == 9) &&
             ((undefined1 *)auStack_c18._8_8_ == (undefined1 *)0x9)) {
            lVar29 = *(long *)(DAT_00b6ab90 + 0x30);
            if (*(long *)(DAT_00b6ab90 + 0x38) != lVar29) {
              auVar43 = vpmovsxbq_avx512f(ZEXT816(0x302010008));
              auVar44 = vpmovsxbq_avx512f(ZEXT816(0x9080403020100));
              auVar42 = vpbroadcastq_avx512vl();
              auVar10 = vpaddq_avx2(auVar42,_DAT_009a7b40);
              auVar40 = vpaddq_avx(auVar42._0_16_,_DAT_009a7bc0);
              uVar30 = 0;
              local_12d8 = &this->m_ebar0;
              auVar43 = vpermi2q_avx512f(auVar43,ZEXT3264(auVar10),ZEXT3264(auVar42));
              auVar43 = vpermi2q_avx512f(auVar44,auVar43,ZEXT1664(auVar40));
              auVar44 = vpbroadcastq_avx512f();
              auVar45._56_8_ = auVar44._56_8_;
              auVar45._0_56_ = auVar43._0_56_;
              local_440 = vmovdqa64_avx512f(auVar45);
              do {
                lhs = local_12d8;
                dVar2 = *(double *)(*(long *)(static_tables_3333 + 0x30) + uVar30 * 8);
                dVar2 = dVar2 + dVar2;
                local_12d0 = uVar30;
                Calc_Sxi_D(this,(MatrixNx3c *)&stack0xfffffffffffffeb0,
                           *(double *)(lVar29 + uVar30 * 8),0.0,0.0);
                Eigen::internal::
                generic_product_impl<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,Eigen::DenseShape,Eigen::DenseShape,8>
                ::evalTo<Eigen::Matrix<double,3,3,1,3,3>>
                          ((Matrix<double,_3,_3,_1,_3,_3> *)local_f48,lhs,
                           (Matrix<double,_9,_3,_0,_9,_3> *)&stack0xfffffffffffffeb0);
                local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.
                m_data.array[0] = (double)&stack0xfffffffffffffeb0;
                local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.
                m_data.array[1] = (double)local_f48;
                local_c20 = (undefined1  [8])&stack0xfffffffffffffeb0;
                Eigen::internal::
                Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
                ::run((Matrix<double,_3,_3,_1,_3,_3> *)auStack_c18,
                      (SrcXprType *)
                      (local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                       m_storage.m_data.array + 1),(assign_op<double,_double> *)&local_10a8);
                auVar21 = local_c20;
                pdVar23 = adStack_1018 + 7;
                lVar29 = 7;
                pMStack_bd0 = (Matrix<double,_9,_9,_1,_9,_9> *)local_c20;
                pdStack_bc8 = (double *)auStack_c18;
                pMStack_bc0 = (RhsNested)0x3;
                do {
                  dVar3 = local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[lVar29 + 0x4c];
                  dVar4 = local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                          m_storage.m_data.array[lVar29 + 0x4f];
                  auVar60._8_8_ = dVar4;
                  auVar60._0_8_ = dVar4;
                  dVar5 = *(double *)(auStack_c18 + lVar29 * 8 + -8);
                  auVar64._8_8_ = dVar5;
                  auVar64._0_8_ = dVar5;
                  lVar29 = lVar29 + 1;
                  auVar52._0_8_ = dVar3 * *(double *)auVar21;
                  auVar52._8_8_ = dVar3 * *(double *)((long)auVar21 + 8);
                  auVar40 = vfmadd231pd_fma(auVar52,auVar60,
                                            *(undefined1 (*) [16])((long)auVar21 + 0x48));
                  auVar40 = vfmadd231pd_fma(auVar40,auVar64,
                                            *(undefined1 (*) [16])((long)auVar21 + 0x90));
                  *(undefined1 (*) [16])(pdVar23 + -8) = auVar40;
                  auVar53._0_8_ = dVar3 * *(double *)((long)auVar21 + 0x10);
                  auVar53._8_8_ = dVar3 * *(double *)((long)auVar21 + 0x18);
                  auVar40 = vfmadd231pd_fma(auVar53,auVar60,
                                            *(undefined1 (*) [16])((long)auVar21 + 0x58));
                  auVar40 = vfmadd231pd_fma(auVar40,auVar64,
                                            *(undefined1 (*) [16])((long)auVar21 + 0xa0));
                  *(undefined1 (*) [16])(pdVar23 + -6) = auVar40;
                  auVar54._0_8_ = dVar3 * *(double *)((long)auVar21 + 0x20);
                  auVar54._8_8_ = dVar3 * *(double *)((long)auVar21 + 0x28);
                  auVar40 = vfmadd231pd_fma(auVar54,auVar60,
                                            *(undefined1 (*) [16])((long)auVar21 + 0x68));
                  auVar40 = vfmadd231pd_fma(auVar40,auVar64,
                                            *(undefined1 (*) [16])((long)auVar21 + 0xb0));
                  *(undefined1 (*) [16])(pdVar23 + -4) = auVar40;
                  auVar55._0_8_ = dVar3 * *(double *)((long)auVar21 + 0x30);
                  auVar55._8_8_ = dVar3 * *(double *)((long)auVar21 + 0x38);
                  auVar40 = vfmadd231pd_fma(auVar55,auVar60,
                                            *(undefined1 (*) [16])((long)auVar21 + 0x78));
                  auVar40 = vfmadd231pd_fma(auVar40,auVar64,
                                            *(undefined1 (*) [16])((long)auVar21 + 0xc0));
                  *(undefined1 (*) [16])(pdVar23 + -2) = auVar40;
                  *pdVar23 = dVar3 * *(double *)((long)auVar21 + 0x40) +
                             dVar4 * *(double *)((long)auVar21 + 0x88) +
                             dVar5 * *(double *)((long)auVar21 + 0xd0);
                  pdVar23 = pdVar23 + 9;
                } while (lVar29 != 10);
                auVar19._8_8_ = dStack_f20;
                auVar19._0_8_ = local_f28;
                auVar20._8_8_ = dStack_f08;
                auVar20._0_8_ = local_f10;
                local_12f0 = (double *)(local_1068 + 0x48);
                auStack_c18._32_8_ = &local_1100;
                pMStack_be0 = &local_1148;
                pMStack_bc0 = (RhsNested)local_1068;
                auVar12._8_8_ = local_f18;
                auVar12._0_8_ = local_f18;
                auVar40 = vmulpd_avx512vl(auVar19,auVar12);
                auVar13._8_8_ = local_f30;
                auVar13._0_8_ = local_f30;
                auVar41 = vfmsub231pd_avx512vl(auVar40,auVar20,auVar13);
                auVar8._8_8_ = 0;
                auVar8._0_8_ = dStack_f08;
                auVar65._8_8_ = 0;
                auVar65._0_8_ = local_f10 * dStack_f20;
                auVar48 = vfmsub132sd_fma(auVar19,auVar65,auVar8);
                auVar40 = vpermilpd_avx(local_f48._8_16_,1);
                auVar61._0_8_ = auVar40._0_8_ * auVar41._0_8_;
                auVar61._8_8_ = auVar40._8_8_ * auVar41._8_8_;
                auVar40 = vshufpd_avx(auVar61,auVar61,1);
                auVar14._8_8_ = 0x8000000000000000;
                auVar14._0_8_ = 0x8000000000000000;
                auVar56._8_8_ = 0;
                auVar56._0_8_ =
                     auVar61._0_8_ + (auVar48._0_8_ * (double)local_f48._0_8_ - auVar40._0_8_);
                auVar40 = vxorpd_avx512vl(auVar56,auVar14);
                local_1170 = (double *)((dVar2 + dVar2) * auVar40._0_8_);
                pdStack_1168 = (double *)0x0;
                auStack_c18._8_8_ = (double)local_1170 * 0.5;
                auStack_c18._24_8_ = local_12f0;
                auStack_c18._40_8_ = local_12f0;
                pdStack_be8 = local_12f0;
                RStack_bd8.m_matrix = (non_const_type)local_12f0;
                pdStack_bc8 = local_12f0;
                RStack_bb8.m_matrix = (non_const_type)local_12f0;
                Eigen::internal::
                call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,9,1,9,9>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,9,3,0,9,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,9,3,0,9,3>>,0>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,9,3,0,9,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,9,3,0,9,3>>,0>const>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,9,3,0,9,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,9,3,0,9,3>>,0>const>const>,Eigen::internal::add_assign_op<double,double>>
                          (local_1158,
                           (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_9,_1,_9,_9>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>,_0>_>_>
                            *)local_c20,(add_assign_op<double,_double> *)&local_eb0);
                peVar27 = (element_type *)0x0;
                local_f00._8_8_ = local_1170;
                local_f00._0_8_ = local_1170;
                do {
                  lVar29 = 0;
                  local_1180 = local_3d8.
                               super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                               m_storage.m_data.array + (long)peVar27 * 0x1b;
                  local_12c8 = peVar27;
                  do {
                    local_10a8.m_rhs.
                    super_BlockImpl<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false,_Eigen::Dense>
                    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false,_true>.
                    m_startCol.m_value = lVar29 * 3;
                    local_10a8.m_lhs = (LhsNested)(local_1068 + 0x48);
                    local_10a8.m_rhs.
                    super_BlockImpl<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false,_Eigen::Dense>
                    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false,_true>.
                    m_xpr = &local_3d8;
                    local_10a8.m_rhs.
                    super_BlockImpl<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false,_Eigen::Dense>
                    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false,_true>.
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false>,_0>
                    .m_data = local_1180 + lVar29 * 3;
                    local_10a8.m_rhs.
                    super_BlockImpl<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false,_Eigen::Dense>
                    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false,_true>.
                    m_outerStride = 9;
                    local_10a8.m_rhs.
                    super_BlockImpl<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false,_Eigen::Dense>
                    .super_BlockImpl_dense<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false,_true>.
                    m_startRow.m_value = (long)peVar27 * 3;
                    local_1070.m_matrix = local_10a8.m_lhs;
                    memset((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_9,_9,_1,_9,_9>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
                            *)local_c20,0,0x288);
                    local_1150 = (undefined1  [8])0x3ff0000000000000;
                    Eigen::internal::
                    generic_product_impl<Eigen::Product<Eigen::Matrix<double,9,3,0,9,3>,Eigen::Block<Eigen::Matrix<double,9,9,1,9,9>,3,3,false>,0>,Eigen::Transpose<Eigen::Matrix<double,9,3,0,9,3>>,Eigen::DenseShape,Eigen::DenseShape,8>
                    ::scaleAndAddTo<Eigen::Matrix<double,9,9,1,9,9>>
                              ((Matrix<double,_9,_9,_1,_9,_9> *)local_c20,&local_10a8,&local_1070,
                               (Scalar *)local_1150);
                    local_1150 = (undefined1  [8])&local_eb0;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[2] = (double)auStack_c18._8_8_;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[3] = (double)auStack_c18._16_8_;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[4] = (double)auStack_c18._24_8_;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[5] = (double)auStack_c18._32_8_;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[6] = (double)auStack_c18._40_8_;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[7] = (double)pdStack_be8;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[8] = (double)pMStack_be0;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[9] = (double)RStack_bd8.m_matrix;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[10] = (double)pMStack_bd0;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0xb] = (double)pdStack_bc8;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0xc] = (double)pMStack_bc0;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0xd] = (double)RStack_bb8.m_matrix;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0xe] = dStack_bb0;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0xf] = dStack_ba8;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x10] = dStack_ba0;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x11] = dStack_b98;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x12] = local_b90;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x13] = dStack_b88;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x14] = dStack_b80;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x15] = dStack_b78;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x16] = dStack_b70;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x17] = dStack_b68;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x18] = dStack_b60;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x19] = dStack_b58;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x1a] = local_b50;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x1b] = dStack_b48;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x1c] = dStack_b40;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x1d] = dStack_b38;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x1e] = dStack_b30;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x1f] = dStack_b28;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x20] = dStack_b20;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x21] = dStack_b18;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x22] = local_b10;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x23] = dStack_b08;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x24] = dStack_b00;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x25] = dStack_af8;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x26] = dStack_af0;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x27] = dStack_ae8;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x28] = dStack_ae0;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x29] = dStack_ad8;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x2a] = local_ad0;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x2b] = dStack_ac8;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x2c] = dStack_ac0;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x2d] = dStack_ab8;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x2e] = dStack_ab0;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x2f] = dStack_aa8;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x30] = dStack_aa0;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x31] = dStack_a98;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x32] = local_a90;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x33] = dStack_a88;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x34] = dStack_a80;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x35] = dStack_a78;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x36] = local_a70;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x37] = dStack_a68;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x38] = local_a60;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x39] = dStack_a58;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x3a] = local_a50;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x3b] = dStack_a48;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x3c] = local_a40;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x3d] = dStack_a38;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x3e] = local_a30;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x3f] = dStack_a28;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0] = (double)local_f00._0_8_ * (double)local_c20;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[1] = (double)local_f00._8_8_ * (double)auStack_c18._0_8_;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x40] = local_a20;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x41] = dStack_a18;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x42] = local_a10;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x43] = dStack_a08;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x44] = local_a00;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x45] = dStack_9f8;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x46] = local_9f0;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x47] = dStack_9e8;
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x48] = local_9e0[0];
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x49] = local_9e0[1];
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x4a] = local_9e0[2];
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x4b] = local_9e0[3];
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x4c] = local_9e0[4];
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x4d] = local_9e0[5];
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x4e] = local_9e0[6];
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x4f] = local_9e0[7];
                    local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage
                    .m_data.array[0x50] = local_9e0[8];
                    local_10a8.m_lhs = (LhsNested)local_1170;
                    local_c20 = (undefined1  [8])local_1150;
                    auStack_c18._0_8_ = &local_10a8;
                    auStack_c18._8_8_ = &local_12d9;
                    auStack_c18._16_8_ = local_1150;
                    Eigen::internal::
                    copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_9,_9,_1,_9,_9>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>,_2,_80>
                    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_9,_9,_1,_9,_9>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
                           *)local_c20);
                    *(double *)(*(long *)local_c20 + 0x280) =
                         *(double *)auStack_c18._0_8_ * *(double *)(*(long *)local_c20 + 0x280);
                    dVar3 = adStack_1018[lVar29 * 9 + -1];
                    dVar4 = adStack_1018[lVar29 * 9];
                    dVar5 = adStack_1018[lVar29 * 9 + 1];
                    dVar6 = adStack_1018[lVar29 * 9 + 2];
                    dVar15 = adStack_1018[lVar29 * 9 + 3];
                    dVar16 = adStack_1018[lVar29 * 9 + 4];
                    dVar17 = adStack_1018[lVar29 * 9 + 5];
                    dVar18 = adStack_1018[lVar29 * 9 + 6];
                    dVar2 = adStack_1018[lVar29 * 9 + 7];
                    lVar39 = 8;
                    pdVar23 = local_12f0;
                    do {
                      dVar7 = *pdVar23;
                      pdVar23 = pdVar23 + 1;
                      local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                      m_storage.m_data.array[lVar39 + 0x4a] = dVar3 * dVar7;
                      local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                      m_storage.m_data.array[lVar39 + 0x4b] = dVar4 * dVar7;
                      local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                      m_storage.m_data.array[lVar39 + 0x4c] = dVar7 * dVar5;
                      local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                      m_storage.m_data.array[lVar39 + 0x4d] = dVar7 * dVar6;
                      local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                      m_storage.m_data.array[lVar39 + 0x4e] = dVar7 * dVar15;
                      local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                      m_storage.m_data.array[lVar39 + 0x4f] = dVar7 * dVar16;
                      local_eb0.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                      m_storage.m_data.array[lVar39 + 0x50] = dVar7 * dVar17;
                      (&dStack_c28)[lVar39] = dVar7 * dVar18;
                      *(double *)(auStack_c18 + lVar39 * 8 + -8) = dVar7 * dVar2;
                      lVar39 = lVar39 + 9;
                    } while (lVar39 != 0x59);
                    auVar43 = vmovdqa64_avx512f(local_440);
                    lVar24 = 0;
                    lVar39 = (this->m_O1).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_rows;
                    pdVar23 = (this->m_O1).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_data + 8;
                    do {
                      lVar33 = (this->m_O1).
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_cols;
                      lVar38 = 0;
                      pdVar28 = pdVar23;
                      do {
                        if ((lVar39 < lVar38 * 9 + 9) || (lVar33 < lVar24 * 9 + 9))
                        goto LAB_0072a57e;
                        lVar35 = 0;
                        dVar2 = local_eb0.
                                super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.
                                m_storage.m_data.array[lVar24 + lVar38 * 9];
                        auVar47._8_8_ = 0;
                        auVar47._0_8_ = dVar2;
                        auVar44 = vbroadcastsd_avx512f(auVar47);
                        pdVar25 = pdVar28;
                        do {
                          auVar45 = vpbroadcastq_avx512f();
                          auVar45 = vpsllq_avx512f(auVar45,3);
                          vpaddq_avx512f(auVar43,auVar45);
                          auVar45 = vgatherqpd_avx512f(*(undefined8 *)(lVar39 * 8));
                          auVar45 = vmulpd_avx512f(auVar44,auVar45);
                          auVar45 = vaddpd_avx512f(auVar45,*(undefined1 (*) [64])(pdVar25 + -8));
                          *(undefined1 (*) [64])(pdVar25 + -8) = auVar45;
                          pdVar34 = local_9e0 + lVar35;
                          lVar35 = lVar35 + 1;
                          *pdVar25 = dVar2 * *pdVar34 + *pdVar25;
                          pdVar25 = pdVar25 + lVar39;
                        } while (lVar35 != 9);
                        lVar38 = lVar38 + 1;
                        pdVar28 = pdVar28 + 9;
                      } while (lVar38 != 9);
                      lVar24 = lVar24 + 1;
                      pdVar23 = pdVar23 + lVar39 * 9;
                    } while (lVar24 != 9);
                    lVar29 = lVar29 + 1;
                  } while (lVar29 != 3);
                  local_12f0 = local_12f0 + 9;
                  peVar27 = (element_type *)((long)&local_12c8->m_rho + 1);
                } while (peVar27 != (element_type *)0x3);
                uVar30 = (ulong)((int)local_12d0 + 1);
                lVar29 = *(long *)(DAT_00b6ab90 + 0x30);
              } while (uVar30 < (ulong)(*(long *)(DAT_00b6ab90 + 0x38) - lVar29 >> 3));
            }
            lVar39 = 0;
            local_1180 = (double *)0x0;
            lVar29 = (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows;
            local_1170 = (this->m_O1).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_data;
            local_f00._0_8_ = lVar29 * 0x48;
            pdVar23 = local_1170;
            do {
              lVar24 = (long)local_1180 * 9 + 9;
              lVar33 = (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       .m_storage.m_cols;
              pdVar25 = (this->m_O2).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_data;
              lVar38 = (this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       .m_storage.m_rows;
              lVar35 = 0;
              pdVar28 = (double *)((long)pdVar25 + lVar38 * lVar39 + 0x40);
              pdVar34 = pdVar23;
              do {
                lVar37 = lVar35 * 9 + 9;
                if ((((lVar29 < lVar37) || (lVar33 < lVar24)) || (lVar38 < lVar37)) ||
                   ((this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols < lVar24)) {
LAB_0072a57e:
                  __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,
                                "Eigen::Block<Eigen::Matrix<double, -1, -1>, 9, 9>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 9, BlockCols = 9, InnerPanel = false]"
                               );
                }
                if (local_1170 + lVar29 * (long)local_1180 * 9 ==
                    pdVar25 + (long)local_1180 * 9 * lVar38 && pdVar25 != (double *)0x0) {
                  __assert_fail("(!check_transpose_aliasing_run_time_selector <typename Derived::Scalar,blas_traits<Derived>::IsTransposed,OtherDerived> ::run(extract_data(dst), other)) && \"aliasing detected during transposition, use transposeInPlace() \" \"or evaluate the rhs into a temporary using .eval()\""
                                ,"/usr/include/eigen3/Eigen/src/Core/Transpose.h",0x1b6,
                                "static void Eigen::internal::checkTransposeAliasing_impl<Eigen::Block<Eigen::Matrix<double, -1, -1>, 9, 9>, Eigen::Transpose<Eigen::Block<Eigen::Matrix<double, -1, -1>, 9, 9>>>::run(const Derived &, const OtherDerived &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 9, 9>, OtherDerived = Eigen::Transpose<Eigen::Block<Eigen::Matrix<double, -1, -1>, 9, 9>>, MightHaveTransposeAliasing = true]"
                               );
                }
                lVar37 = 0;
                pdVar36 = pdVar28;
                do {
                  pdVar1 = pdVar34 + lVar37;
                  lVar37 = lVar37 + 1;
                  pdVar36[-8] = *pdVar1;
                  pdVar36[-7] = pdVar1[lVar29];
                  pdVar36[-6] = pdVar1[lVar29 * 2];
                  pdVar36[-5] = pdVar1[lVar29 * 3];
                  pdVar36[-4] = pdVar1[lVar29 * 4];
                  pdVar36[-3] = pdVar1[lVar29 * 5];
                  pdVar36[-2] = pdVar1[lVar29 * 6];
                  pdVar36[-1] = pdVar1[lVar29 * 7];
                  *pdVar36 = pdVar1[lVar29 * 8];
                  pdVar36 = pdVar36 + lVar38;
                } while (lVar37 != 9);
                lVar35 = lVar35 + 1;
                pdVar34 = pdVar34 + 9;
                pdVar28 = pdVar28 + 9;
              } while (lVar35 != 9);
              pdVar23 = pdVar23 + lVar29 * 9;
              local_1180 = (double *)((long)local_1180 + 1);
              lVar39 = lVar39 + 0x48;
              if (local_1180 == (double *)0x9) {
                return;
              }
            } while( true );
          }
        }
        __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 9, 9, 1>>::finished() [MatrixType = Eigen::Matrix<double, 9, 9, 1>]"
                     );
      }
    }
  }
  auStack_c18._8_8_ = 0.0;
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, PlainObjectType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

void ChElementBeamANCF_3333::PrecomputeInternalForceMatricesWeightsPreInt() {
    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi = NP - 1;        // Gauss-Quadrature table index for xi
    unsigned int GQ_idx_eta_zeta = NT - 1;  // Gauss-Quadrature table index for eta and zeta

    m_O1.resize(NSF * NSF, NSF * NSF);
    m_O2.resize(NSF * NSF, NSF * NSF);
    m_K3Compact.resize(NSF, NSF);
    m_K13Compact.resize(NSF, NSF);

    m_K13Compact.setZero();
    m_K3Compact.setZero();
    m_O1.setZero();

    // =============================================================================
    // =============================================================================
    // Calculate the contribution to constant matrices needed to account for the integration across the volume of the
    // beam element, excluding the Poisson effect for the Enhanced Continuum Mechanics method
    // =============================================================================
    // =============================================================================

    // Get the components of the stiffness tensor in 6x6 matrix form that exclude the Poisson effect
    const ChVectorN<double, 6>& D0 = GetMaterial()->Get_D0();
    ChMatrixNM<double, 6, 6> D;
    D.setZero();
    D.diagonal() = D0;

    // Setup the stiffness tensor in block matrix form to make it easier to iterate through all 4 subscripts
    ChMatrixNM<double, 9, 9> D_block;
    D_block << D(0, 0), D(0, 5), D(0, 4), D(0, 5), D(0, 1), D(0, 3), D(0, 4), D(0, 3), D(0, 2), D(5, 0), D(5, 5),
        D(5, 4), D(5, 5), D(5, 1), D(5, 3), D(5, 4), D(5, 3), D(5, 2), D(4, 0), D(4, 5), D(4, 4), D(4, 5), D(4, 1),
        D(4, 3), D(4, 4), D(4, 3), D(4, 2), D(5, 0), D(5, 5), D(5, 4), D(5, 5), D(5, 1), D(5, 3), D(5, 4), D(5, 3),
        D(5, 2), D(1, 0), D(1, 5), D(1, 4), D(1, 5), D(1, 1), D(1, 3), D(1, 4), D(1, 3), D(1, 2), D(3, 0), D(3, 5),
        D(3, 4), D(3, 5), D(3, 1), D(3, 3), D(3, 4), D(3, 3), D(3, 2), D(4, 0), D(4, 5), D(4, 4), D(4, 5), D(4, 1),
        D(4, 3), D(4, 4), D(4, 3), D(4, 2), D(3, 0), D(3, 5), D(3, 4), D(3, 5), D(3, 1), D(3, 3), D(3, 4), D(3, 3),
        D(3, 2), D(2, 0), D(2, 5), D(2, 4), D(2, 5), D(2, 1), D(2, 3), D(2, 4), D(2, 3), D(2, 2);

    // Pre-calculate the matrices of normalized shape function derivatives corrected for a potentially non-straight
    // reference configuration & GQ Weights times the determinate of the element Jacobian for later Calculating the
    // portion of the Selective Reduced Integration that does account for the Poisson effect
    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi].size(); it_xi++) {
        for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_eta_zeta].size(); it_eta++) {
            for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_eta_zeta].size(); it_zeta++) {
                double GQ_weight = GQTable->Weight[GQ_idx_xi][it_xi] * GQTable->Weight[GQ_idx_eta_zeta][it_eta] *
                                   GQTable->Weight[GQ_idx_eta_zeta][it_zeta];
                double xi = GQTable->Lroots[GQ_idx_xi][it_xi];
                double eta = GQTable->Lroots[GQ_idx_eta_zeta][it_eta];
                double zeta = GQTable->Lroots[GQ_idx_eta_zeta][it_zeta];

                ChMatrix33<double>
                    J_0xi;         // Element Jacobian between the reference configuration and normalized configuration
                MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives

                Calc_Sxi_D(Sxi_D, xi, eta, zeta);
                J_0xi.noalias() = m_ebar0 * Sxi_D;

                MatrixNx3c Sxi_D_0xi = Sxi_D * J_0xi.inverse();
                double GQWeight_det_J_0xi = -J_0xi.determinant() * GQ_weight;

                // Shortcut for:
                // m_K3Compact += GQWeight_det_J_0xi * 0.5 * (Sxi_D_0xi*D11*Sxi_D_0xi.transpose() + Sxi_D_0xi *
                // D22*Sxi_D_0xi.transpose() + Sxi_D_0xi * D33*Sxi_D_0xi.transpose());
                m_K3Compact += GQWeight_det_J_0xi * 0.5 *
                               (D0(0) * Sxi_D_0xi.template block<NSF, 1>(0, 0) *
                                    Sxi_D_0xi.template block<NSF, 1>(0, 0).transpose() +
                                D0(1) * Sxi_D_0xi.template block<NSF, 1>(0, 1) *
                                    Sxi_D_0xi.template block<NSF, 1>(0, 1).transpose() +
                                D0(2) * Sxi_D_0xi.template block<NSF, 1>(0, 2) *
                                    Sxi_D_0xi.template block<NSF, 1>(0, 2).transpose());

                MatrixNxN scale;
                for (unsigned int n = 0; n < 3; n++) {
                    for (unsigned int c = 0; c < 3; c++) {
                        scale = Sxi_D_0xi * D_block.block<3, 3>(3 * n, 3 * c) * Sxi_D_0xi.transpose();
                        scale *= GQWeight_det_J_0xi;

                        MatrixNxN Sxi_D_0xi_n_Sxi_D_0xi_c_transpose =
                            Sxi_D_0xi.template block<NSF, 1>(0, n) * Sxi_D_0xi.template block<NSF, 1>(0, c).transpose();
                        for (unsigned int f = 0; f < NSF; f++) {
                            for (unsigned int t = 0; t < NSF; t++) {
                                m_O1.block<NSF, NSF>(NSF * t, NSF * f) +=
                                    scale(t, f) * Sxi_D_0xi_n_Sxi_D_0xi_c_transpose;
                            }
                        }
                    }
                }
            }
        }
    }

    // =============================================================================
    // =============================================================================
    // Calculate the contribution to constant matrices needed to account for the integration across the volume of the
    // beam element, including the Poisson effect only along the beam axis (selective reduced integration) with 1 point
    // Gauss quadrature for the cross section directions
    // =============================================================================
    // =============================================================================

    // Get the components of the stiffness tensor in 6x6 matrix form that include the Poisson effect

    D.setZero();
    D.block(0, 0, 3, 3) = GetMaterial()->Get_Dv();

    // =============================================================================
    // Pull the required entries from the 4th order stiffness tensor that are needed for K3.  Note that D is written
    // in Voigt notation rather than a 4th other tensor so the correct entries from that matrix need to be pulled.
    // D11 = slice (matrix) of the 4th order tensor with last two subscripts = 1)
    // D22 = slice (matrix) of the 4th order tensor with last two subscripts = 2)
    // D33 = slice (matrix) of the 4th order tensor with last two subscripts = 3)
    // =============================================================================
    ChMatrixNM<double, 3, 3> D11;
    ChMatrixNM<double, 3, 3> D22;
    ChMatrixNM<double, 3, 3> D33;
    D11(0, 0) = D(0, 0);
    D11(1, 1) = D(1, 0);
    D11(2, 2) = D(2, 0);
    D11(1, 0) = D(5, 0);
    D11(0, 1) = D(5, 0);
    D11(2, 0) = D(4, 0);
    D11(0, 2) = D(4, 0);
    D11(2, 1) = D(3, 0);
    D11(1, 2) = D(3, 0);

    D22(0, 0) = D(0, 1);
    D22(1, 1) = D(1, 1);
    D22(2, 2) = D(2, 1);
    D22(1, 0) = D(5, 1);
    D22(0, 1) = D(5, 1);
    D22(2, 0) = D(4, 1);
    D22(0, 2) = D(4, 1);
    D22(2, 1) = D(3, 1);
    D22(1, 2) = D(3, 1);

    D33(0, 0) = D(0, 2);
    D33(1, 1) = D(1, 2);
    D33(2, 2) = D(2, 2);
    D33(1, 0) = D(5, 2);
    D33(0, 1) = D(5, 2);
    D33(2, 0) = D(4, 2);
    D33(0, 2) = D(4, 2);
    D33(2, 1) = D(3, 2);
    D33(1, 2) = D(3, 2);

    // Setup the stiffness tensor in block matrix form to make it easier to iterate through all 4 subscripts
    D_block << D(0, 0), D(0, 5), D(0, 4), D(0, 5), D(0, 1), D(0, 3), D(0, 4), D(0, 3), D(0, 2), D(5, 0), D(5, 5),
        D(5, 4), D(5, 5), D(5, 1), D(5, 3), D(5, 4), D(5, 3), D(5, 2), D(4, 0), D(4, 5), D(4, 4), D(4, 5), D(4, 1),
        D(4, 3), D(4, 4), D(4, 3), D(4, 2), D(5, 0), D(5, 5), D(5, 4), D(5, 5), D(5, 1), D(5, 3), D(5, 4), D(5, 3),
        D(5, 2), D(1, 0), D(1, 5), D(1, 4), D(1, 5), D(1, 1), D(1, 3), D(1, 4), D(1, 3), D(1, 2), D(3, 0), D(3, 5),
        D(3, 4), D(3, 5), D(3, 1), D(3, 3), D(3, 4), D(3, 3), D(3, 2), D(4, 0), D(4, 5), D(4, 4), D(4, 5), D(4, 1),
        D(4, 3), D(4, 4), D(4, 3), D(4, 2), D(3, 0), D(3, 5), D(3, 4), D(3, 5), D(3, 1), D(3, 3), D(3, 4), D(3, 3),
        D(3, 2), D(2, 0), D(2, 5), D(2, 4), D(2, 5), D(2, 1), D(2, 3), D(2, 4), D(2, 3), D(2, 2);

    // Loop over each Gauss quadrature point and sum the contribution to each constant matrix that will be used for
    // the internal force calculations
    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi].size(); it_xi++) {
        double GQ_weight = GQTable->Weight[GQ_idx_xi][it_xi] * 2 * 2;
        double xi = GQTable->Lroots[GQ_idx_xi][it_xi];
        double eta = 0;
        double zeta = 0;

        ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
        MatrixNx3c Sxi_D;          // Matrix of normalized shape function derivatives

        Calc_Sxi_D(Sxi_D, xi, eta, zeta);
        J_0xi.noalias() = m_ebar0 * Sxi_D;

        MatrixNx3c Sxi_D_0xi = Sxi_D * J_0xi.inverse();
        double GQWeight_det_J_0xi = -J_0xi.determinant() * GQ_weight;

        m_K3Compact += GQWeight_det_J_0xi * 0.5 *
                       (Sxi_D_0xi * D11 * Sxi_D_0xi.transpose() + Sxi_D_0xi * D22 * Sxi_D_0xi.transpose() +
                        Sxi_D_0xi * D33 * Sxi_D_0xi.transpose());

        MatrixNxN scale;
        for (unsigned int n = 0; n < 3; n++) {
            for (unsigned int c = 0; c < 3; c++) {
                scale = Sxi_D_0xi * D_block.block<3, 3>(3 * n, 3 * c) * Sxi_D_0xi.transpose();
                scale *= GQWeight_det_J_0xi;

                MatrixNxN Sxi_D_0xi_n_Sxi_D_0xi_c_transpose =
                    Sxi_D_0xi.template block<NSF, 1>(0, n) * Sxi_D_0xi.template block<NSF, 1>(0, c).transpose();
                for (unsigned int f = 0; f < NSF; f++) {
                    for (unsigned int t = 0; t < NSF; t++) {
                        m_O1.block<NSF, NSF>(NSF * t, NSF * f) += scale(t, f) * Sxi_D_0xi_n_Sxi_D_0xi_c_transpose;
                    }
                }
            }
        }
    }

    // Since O2 is just a reordered version of O1, wait until O1 is completely calculated and then generate O2 from it
    for (unsigned int f = 0; f < NSF; f++) {
        for (unsigned int t = 0; t < NSF; t++) {
            m_O2.block<NSF, NSF>(NSF * t, NSF * f) = m_O1.block<NSF, NSF>(NSF * t, NSF * f).transpose();
        }
    }
}